

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim_sse2.c
# Opt level: O1

uint32_t AccumulateSSE_SSE2(uint8_t *src1,uint8_t *src2,int len)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  uint uVar31;
  long lVar32;
  ulong uVar33;
  uint32_t uVar34;
  undefined1 auVar35 [16];
  int iVar36;
  int iVar39;
  int iVar40;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  
  uVar34 = 0;
  uVar31 = 0;
  if (0xf < len) {
    auVar35 = *(undefined1 (*) [16])src2;
    auVar43 = *(undefined1 (*) [16])src1;
    lVar32 = 0x10;
    if (len < 0x30) {
      iVar36 = 0;
      iVar39 = 0;
      iVar40 = 0;
      iVar41 = 0;
    }
    else {
      lVar32 = 0x10;
      iVar36 = 0;
      iVar39 = 0;
      iVar40 = 0;
      iVar41 = 0;
      do {
        auVar42 = psubusb(auVar43,auVar35);
        auVar35 = psubusb(auVar35,auVar43);
        auVar35 = auVar35 | auVar42;
        auVar1[0xd] = 0;
        auVar1._0_13_ = auVar35._0_13_;
        auVar1[0xe] = auVar35[7];
        auVar4[0xc] = auVar35[6];
        auVar4._0_12_ = auVar35._0_12_;
        auVar4._13_2_ = auVar1._13_2_;
        auVar7[0xb] = 0;
        auVar7._0_11_ = auVar35._0_11_;
        auVar7._12_3_ = auVar4._12_3_;
        auVar10[10] = auVar35[5];
        auVar10._0_10_ = auVar35._0_10_;
        auVar10._11_4_ = auVar7._11_4_;
        auVar13[9] = 0;
        auVar13._0_9_ = auVar35._0_9_;
        auVar13._10_5_ = auVar10._10_5_;
        auVar16[8] = auVar35[4];
        auVar16._0_8_ = auVar35._0_8_;
        auVar16._9_6_ = auVar13._9_6_;
        auVar22._7_8_ = 0;
        auVar22._0_7_ = auVar16._8_7_;
        auVar25._1_8_ = SUB158(auVar22 << 0x40,7);
        auVar25[0] = auVar35[3];
        auVar25._9_6_ = 0;
        auVar26._1_10_ = SUB1510(auVar25 << 0x30,5);
        auVar26[0] = auVar35[2];
        auVar26._11_4_ = 0;
        auVar19[2] = auVar35[1];
        auVar19._0_2_ = auVar35._0_2_;
        auVar19._3_12_ = SUB1512(auVar26 << 0x20,3);
        auVar42._0_2_ = auVar35._0_2_ & 0xff;
        auVar42._2_13_ = auVar19._2_13_;
        auVar42[0xf] = 0;
        auVar43[1] = 0;
        auVar43[0] = auVar35[8];
        auVar43[2] = auVar35[9];
        auVar43[3] = 0;
        auVar43[4] = auVar35[10];
        auVar43[5] = 0;
        auVar43[6] = auVar35[0xb];
        auVar43[7] = 0;
        auVar43[8] = auVar35[0xc];
        auVar43[9] = 0;
        auVar43[10] = auVar35[0xd];
        auVar43[0xb] = 0;
        auVar43[0xc] = auVar35[0xe];
        auVar43[0xd] = 0;
        auVar43[0xe] = auVar35[0xf];
        auVar43[0xf] = 0;
        auVar44 = pmaddwd(auVar42,auVar42);
        auVar42 = pmaddwd(auVar43,auVar43);
        auVar35 = psubusb(*(undefined1 (*) [16])(src1 + lVar32),
                          *(undefined1 (*) [16])(src2 + lVar32));
        auVar37 = psubusb(*(undefined1 (*) [16])(src2 + lVar32),
                          *(undefined1 (*) [16])(src1 + lVar32));
        auVar37 = auVar37 | auVar35;
        auVar2[0xd] = 0;
        auVar2._0_13_ = auVar37._0_13_;
        auVar2[0xe] = auVar37[7];
        auVar5[0xc] = auVar37[6];
        auVar5._0_12_ = auVar37._0_12_;
        auVar5._13_2_ = auVar2._13_2_;
        auVar8[0xb] = 0;
        auVar8._0_11_ = auVar37._0_11_;
        auVar8._12_3_ = auVar5._12_3_;
        auVar11[10] = auVar37[5];
        auVar11._0_10_ = auVar37._0_10_;
        auVar11._11_4_ = auVar8._11_4_;
        auVar14[9] = 0;
        auVar14._0_9_ = auVar37._0_9_;
        auVar14._10_5_ = auVar11._10_5_;
        auVar17[8] = auVar37[4];
        auVar17._0_8_ = auVar37._0_8_;
        auVar17._9_6_ = auVar14._9_6_;
        auVar23._7_8_ = 0;
        auVar23._0_7_ = auVar17._8_7_;
        auVar27._1_8_ = SUB158(auVar23 << 0x40,7);
        auVar27[0] = auVar37[3];
        auVar27._9_6_ = 0;
        auVar28._1_10_ = SUB1510(auVar27 << 0x30,5);
        auVar28[0] = auVar37[2];
        auVar28._11_4_ = 0;
        auVar20[2] = auVar37[1];
        auVar20._0_2_ = auVar37._0_2_;
        auVar20._3_12_ = SUB1512(auVar28 << 0x20,3);
        auVar35._0_2_ = auVar37._0_2_ & 0xff;
        auVar35._2_13_ = auVar20._2_13_;
        auVar35[0xf] = 0;
        auVar45 = pmaddwd(auVar35,auVar35);
        auVar35 = *(undefined1 (*) [16])(src2 + lVar32 + 0x10);
        auVar43 = *(undefined1 (*) [16])(src1 + lVar32 + 0x10);
        lVar32 = lVar32 + 0x20;
        auVar38[1] = 0;
        auVar38[0] = auVar37[8];
        auVar38[2] = auVar37[9];
        auVar38[3] = 0;
        auVar38[4] = auVar37[10];
        auVar38[5] = 0;
        auVar38[6] = auVar37[0xb];
        auVar38[7] = 0;
        auVar38[8] = auVar37[0xc];
        auVar38[9] = 0;
        auVar38[10] = auVar37[0xd];
        auVar38[0xb] = 0;
        auVar38[0xc] = auVar37[0xe];
        auVar38[0xd] = 0;
        auVar38[0xe] = auVar37[0xf];
        auVar38[0xf] = 0;
        auVar37 = pmaddwd(auVar38,auVar38);
        iVar36 = auVar37._0_4_ + auVar45._0_4_ + auVar42._0_4_ + auVar44._0_4_ + iVar36;
        iVar39 = auVar37._4_4_ + auVar45._4_4_ + auVar42._4_4_ + auVar44._4_4_ + iVar39;
        iVar40 = auVar37._8_4_ + auVar45._8_4_ + auVar42._8_4_ + auVar44._8_4_ + iVar40;
        iVar41 = auVar37._12_4_ + auVar45._12_4_ + auVar42._12_4_ + auVar44._12_4_ + iVar41;
      } while (lVar32 <= len + -0x20);
    }
    uVar31 = (uint)lVar32;
    auVar42 = psubusb(auVar43,auVar35);
    auVar35 = psubusb(auVar35,auVar43);
    auVar35 = auVar35 | auVar42;
    auVar3[0xd] = 0;
    auVar3._0_13_ = auVar35._0_13_;
    auVar3[0xe] = auVar35[7];
    auVar6[0xc] = auVar35[6];
    auVar6._0_12_ = auVar35._0_12_;
    auVar6._13_2_ = auVar3._13_2_;
    auVar9[0xb] = 0;
    auVar9._0_11_ = auVar35._0_11_;
    auVar9._12_3_ = auVar6._12_3_;
    auVar12[10] = auVar35[5];
    auVar12._0_10_ = auVar35._0_10_;
    auVar12._11_4_ = auVar9._11_4_;
    auVar15[9] = 0;
    auVar15._0_9_ = auVar35._0_9_;
    auVar15._10_5_ = auVar12._10_5_;
    auVar18[8] = auVar35[4];
    auVar18._0_8_ = auVar35._0_8_;
    auVar18._9_6_ = auVar15._9_6_;
    auVar24._7_8_ = 0;
    auVar24._0_7_ = auVar18._8_7_;
    auVar29._1_8_ = SUB158(auVar24 << 0x40,7);
    auVar29[0] = auVar35[3];
    auVar29._9_6_ = 0;
    auVar30._1_10_ = SUB1510(auVar29 << 0x30,5);
    auVar30[0] = auVar35[2];
    auVar30._11_4_ = 0;
    auVar21[2] = auVar35[1];
    auVar21._0_2_ = auVar35._0_2_;
    auVar21._3_12_ = SUB1512(auVar30 << 0x20,3);
    auVar44._0_2_ = auVar35._0_2_ & 0xff;
    auVar44._2_13_ = auVar21._2_13_;
    auVar44[0xf] = 0;
    auVar37[1] = 0;
    auVar37[0] = auVar35[8];
    auVar37[2] = auVar35[9];
    auVar37[3] = 0;
    auVar37[4] = auVar35[10];
    auVar37[5] = 0;
    auVar37[6] = auVar35[0xb];
    auVar37[7] = 0;
    auVar37[8] = auVar35[0xc];
    auVar37[9] = 0;
    auVar37[10] = auVar35[0xd];
    auVar37[0xb] = 0;
    auVar37[0xc] = auVar35[0xe];
    auVar37[0xd] = 0;
    auVar37[0xe] = auVar35[0xf];
    auVar37[0xf] = 0;
    auVar43 = pmaddwd(auVar44,auVar44);
    auVar35 = pmaddwd(auVar37,auVar37);
    uVar34 = auVar35._12_4_ + auVar43._12_4_ + iVar41 + auVar35._4_4_ + auVar43._4_4_ + iVar39 +
             auVar35._8_4_ + auVar43._8_4_ + iVar40 + auVar35._0_4_ + auVar43._0_4_ + iVar36;
  }
  if ((int)uVar31 < len) {
    uVar33 = (ulong)uVar31;
    do {
      uVar34 = uVar34 + ((uint)src1[uVar33] - (uint)src2[uVar33]) *
                        ((uint)src1[uVar33] - (uint)src2[uVar33]);
      uVar33 = uVar33 + 1;
    } while ((uint)len != uVar33);
  }
  return uVar34;
}

Assistant:

static uint32_t AccumulateSSE_SSE2(const uint8_t* src1,
                                   const uint8_t* src2, int len) {
  int i = 0;
  uint32_t sse2 = 0;
  if (len >= 16) {
    const int limit = len - 32;
    int32_t tmp[4];
    __m128i sum1;
    __m128i sum = _mm_setzero_si128();
    __m128i a0 = _mm_loadu_si128((const __m128i*)&src1[i]);
    __m128i b0 = _mm_loadu_si128((const __m128i*)&src2[i]);
    i += 16;
    while (i <= limit) {
      const __m128i a1 = _mm_loadu_si128((const __m128i*)&src1[i]);
      const __m128i b1 = _mm_loadu_si128((const __m128i*)&src2[i]);
      __m128i sum2;
      i += 16;
      SubtractAndSquare_SSE2(a0, b0, &sum1);
      sum = _mm_add_epi32(sum, sum1);
      a0 = _mm_loadu_si128((const __m128i*)&src1[i]);
      b0 = _mm_loadu_si128((const __m128i*)&src2[i]);
      i += 16;
      SubtractAndSquare_SSE2(a1, b1, &sum2);
      sum = _mm_add_epi32(sum, sum2);
    }
    SubtractAndSquare_SSE2(a0, b0, &sum1);
    sum = _mm_add_epi32(sum, sum1);
    _mm_storeu_si128((__m128i*)tmp, sum);
    sse2 += (tmp[3] + tmp[2] + tmp[1] + tmp[0]);
  }

  for (; i < len; ++i) {
    const int32_t diff = src1[i] - src2[i];
    sse2 += diff * diff;
  }
  return sse2;
}